

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

int classify_keyword(char *start,char *end,int flags)

{
  int iVar1;
  int flags_local;
  char *end_local;
  char *start_local;
  
  if (((long)end - (long)start == 5) && (iVar1 = my_memcasecmp(start,"alpha",5), iVar1 == 0)) {
    return 1;
  }
  if (((long)end - (long)start == 4) && (iVar1 = my_memcasecmp(start,"beta",4), iVar1 == 0)) {
    return 1;
  }
  if (((long)end - (long)start == 2) && (iVar1 = my_memcasecmp(start,"rc",2), iVar1 == 0)) {
    return 1;
  }
  if ((2 < (long)end - (long)start) && (iVar1 = my_memcasecmp(start,"pre",3), iVar1 == 0)) {
    return 1;
  }
  if ((3 < (long)end - (long)start) && (iVar1 = my_memcasecmp(start,"post",4), iVar1 == 0)) {
    return 2;
  }
  if ((4 < (long)end - (long)start) && (iVar1 = my_memcasecmp(start,"patch",5), iVar1 == 0)) {
    return 2;
  }
  if (((long)end - (long)start == 2) && (iVar1 = my_memcasecmp(start,"pl",2), iVar1 == 0)) {
    return 2;
  }
  if (((long)end - (long)start == 6) && (iVar1 = my_memcasecmp(start,"errata",6), iVar1 == 0)) {
    return 2;
  }
  if ((((flags & 1U) == 0) || ((long)end - (long)start != 1)) ||
     ((*start != 'p' && (*start != 'P')))) {
    start_local._4_4_ = 0;
  }
  else {
    start_local._4_4_ = 2;
  }
  return start_local._4_4_;
}

Assistant:

static int classify_keyword(const char* start, const char* end, int flags) {
	if (end - start == 5 && my_memcasecmp(start, "alpha", 5) == 0)
		return KEYWORD_PRE_RELEASE;
	else if (end - start == 4 && my_memcasecmp(start, "beta", 4) == 0)
		return KEYWORD_PRE_RELEASE;
	else if (end - start == 2 && my_memcasecmp(start, "rc", 2) == 0)
		return KEYWORD_PRE_RELEASE;
	else if (end - start >= 3 && my_memcasecmp(start, "pre", 3) == 0)
		return KEYWORD_PRE_RELEASE;
	else if (end - start >= 4 && my_memcasecmp(start, "post", 4) == 0)
		return KEYWORD_POST_RELEASE;
	else if (end - start >= 5 && my_memcasecmp(start, "patch", 5) == 0)
		return KEYWORD_POST_RELEASE;
	else if (end - start == 2 && my_memcasecmp(start, "pl", 2) == 0)  /* patchlevel */
		return KEYWORD_POST_RELEASE;
	else if (end - start == 6 && my_memcasecmp(start, "errata", 6) == 0)
		return KEYWORD_POST_RELEASE;
	else if (flags & VERSIONFLAG_P_IS_PATCH && end - start == 1 && (*start == 'p' || *start == 'P'))
		return KEYWORD_POST_RELEASE;

	return KEYWORD_UNKNOWN;
}